

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::_makeunreachable(TranslateToFuzzReader *this)

{
  WeightedOption weightedOption;
  FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *this_00;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *this_01;
  code *pcVar1;
  Expression *pEVar2;
  long extraout_RDX;
  long *plVar3;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  local_88;
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28 = makeBreak;
  uStack_20 = 0;
  local_58 = makeCallIndirect;
  uStack_50 = 0;
  local_18 = 2;
  local_48 = makeSwitch;
  uStack_40 = 0;
  local_38 = makeReturn;
  uStack_30 = 0;
  weightedOption.weight = 2;
  weightedOption._0_16_ = ZEXT816(0x13fe64);
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = (FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
            Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
            add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                      ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                        *)&local_88,(FeatureSet)0x0,weightedOption,0x143c76,0,0x140082,0,0x140264);
  this_01 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
            add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                      (this_00,(FeatureSet)0x40,0x143e94,0);
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
            (this_01,(FeatureSet)0x500,0x140afa);
  pcVar1 = (code *)_wasm__TranslateToFuzzReader___constwasm__Random__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                             (&this->random,
                              (FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                               *)&local_88);
  plVar3 = (long *)((long)&this->wasm + extraout_RDX);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar3 + -1);
  }
  pEVar2 = (Expression *)(*pcVar1)(plVar3,1);
  std::
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  ::~_Rb_tree(&local_88);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::_makeunreachable() {
  using Self = TranslateToFuzzReader;
  auto options = FeatureOptions<Expression* (Self::*)(Type)>();
  using WeightedOption = decltype(options)::WeightedOption;
  // Many instructions can become unreachable if a child is unreachable. We
  // create such code in mutate() (see |allowUnreachable| there). The list of
  // instructions here are those that necessarily have unreachable type, and are
  // only created here (though they might have other variations that are
  // reachable, like br has br_if that is created elsewhere, and we have call
  // here because of return calls, etc.).
  options
    .add(FeatureSet::MVP,
         WeightedOption{&Self::makeBreak, Important},
         &Self::makeUnreachable,
         &Self::makeCall,
         &Self::makeCallIndirect,
         &Self::makeSwitch,
         &Self::makeReturn)
    .add(FeatureSet::ExceptionHandling, &Self::makeThrow, &Self::makeThrowRef)
    .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeCallRef);
  return (this->*pick(options))(Type::unreachable);
}